

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<cs_impl::any_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
::cni_holder(cni_holder<cs_impl::any_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
             *this,_func_any_deque<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr **func)

{
  function<cs_impl::any_(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)> *in_RDI;
  cni_helper<cs_impl::any_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  *this_00;
  function<cs_impl::any_(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  *in_stack_ffffffffffffffc0;
  _func_any_deque<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003b9120;
  this_00 = (cni_helper<cs_impl::any_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<cs_impl::any(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&)>::
  function<cs_impl::any(*const&)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&),void>
            (in_stack_ffffffffffffffc0,local_30);
  cni_helper<cs_impl::any_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  ::cni_helper(this_00,in_RDI);
  std::function<cs_impl::any_(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::~function
            ((function<cs_impl::any_(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)> *)
             0x2721c6);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}